

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O0

void google::protobuf::compiler::javanano::
     GenerateSibling<google::protobuf::compiler::javanano::MessageGenerator,google::protobuf::Descriptor>
               (string *package_dir,string *java_package,Descriptor *descriptor,
               GeneratorContext *output_directory,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *file_list,Params *params)

{
  int iVar1;
  string *__rhs;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  ulong uVar2;
  MessageGenerator local_140;
  undefined1 local_118 [8];
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string filename;
  Params *params_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *output_directory_local;
  Descriptor *descriptor_local;
  string *java_package_local;
  string *package_dir_local;
  
  filename.field_2._8_8_ = params;
  __rhs = Descriptor::name_abi_cxx11_(descriptor);
  std::operator+(&local_78,package_dir,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,".java");
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(file_list,(value_type *)local_58);
  iVar1 = (*output_directory->_vptr_GeneratorContext[2])(output_directory,local_58);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
             &printer.annotation_collector_,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1));
  output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                        ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                         &printer.annotation_collector_);
  io::Printer::Printer((Printer *)local_118,output_00,'$');
  io::Printer::Print((Printer *)local_118,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    io::Printer::Print((Printer *)local_118,"\npackage $package$;\n","package",java_package);
  }
  MessageGenerator::MessageGenerator(&local_140,descriptor,(Params *)filename.field_2._8_8_);
  MessageGenerator::Generate(&local_140,(Printer *)local_118);
  MessageGenerator::~MessageGenerator(&local_140);
  io::Printer::~Printer((Printer *)local_118);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
             &printer.annotation_collector_);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* output_directory,
                            vector<string>* file_list,
                            const Params& params) {
  string filename = package_dir + descriptor->name() + ".java";
  file_list->push_back(filename);

  scoped_ptr<io::ZeroCopyOutputStream> output(
    output_directory->Open(filename));
  io::Printer printer(output.get(), '$');

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if (!java_package.empty()) {
    printer.Print(
      "\n"
      "package $package$;\n",
      "package", java_package);
  }

  GeneratorClass(descriptor, params).Generate(&printer);
}